

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_disto.c
# Opt level: O2

int RescalePlane(uint8_t *src,int src_width,int src_height,int src_stride,uint8_t *dst,int dst_width
                ,int dst_height,int dst_stride,rescaler_t *work,int num_channels)

{
  int iVar1;
  int iVar2;
  int iVar3;
  WebPRescaler rescaler;
  
  iVar1 = WebPRescalerInit(&rescaler,src_width,src_height,dst,dst_width,dst_height,dst_stride,
                           num_channels,work);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = 1;
    for (iVar3 = 0; src_height - iVar3 != 0 && iVar3 <= src_height; iVar3 = iVar3 + iVar2) {
      iVar2 = WebPRescalerImport(&rescaler,src_height - iVar3,src + iVar3 * src_stride,src_stride);
      WebPRescalerExport(&rescaler);
    }
  }
  return iVar1;
}

Assistant:

static void RescalePlane(uint8_t* plane, int width, int height,
                         int x_stride, int y_stride, int max) {
  const uint32_t factor = (max > 0) ? (255u << 16) / max : 0;
  int x, y;
  for (y = 0; y < height; ++y) {
    uint8_t* const ptr = plane + y * y_stride;
    for (x = 0; x < width * x_stride; x += x_stride) {
      const uint32_t diff = (ptr[x] * factor + (1 << 15)) >> 16;
      ptr[x] = diff;
    }
  }
}